

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApprover.cpp
# Opt level: O2

void ApprovalTests::FileApprover::reportAfterTryingFrontLoadedReporter
               (string *receivedPath,string *approvedPath,Reporter *r)

{
  char cVar1;
  shared_ptr<ApprovalTests::Reporter> tryFirst;
  long *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  
  FrontLoadedReporterFactory::getFrontLoadedReporter();
  ::std::__cxx11::string::string(local_48,receivedPath);
  ::std::__cxx11::string::string(local_68,approvedPath);
  cVar1 = (**(code **)(*local_b8 + 0x10))(local_b8,local_48,local_68);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string(local_48);
  if (cVar1 == '\0') {
    ::std::__cxx11::string::string(local_88,receivedPath);
    ::std::__cxx11::string::string(local_a8,approvedPath);
    (*r->_vptr_Reporter[2])(r,local_88,local_a8);
    ::std::__cxx11::string::~string(local_a8);
    ::std::__cxx11::string::~string(local_88);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  return;
}

Assistant:

void
    FileApprover::reportAfterTryingFrontLoadedReporter(const std::string& receivedPath,
                                                       const std::string& approvedPath,
                                                       const Reporter& r)
    {
        auto tryFirst = FrontLoadedReporterFactory::getFrontLoadedReporter();
        if (!tryFirst->report(receivedPath, approvedPath))
        {
            r.report(receivedPath, approvedPath);
        }
    }